

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O3

void __thiscall DNSResolve::ParseHosts(DNSResolve *this)

{
  byte *pbVar1;
  byte bVar2;
  long *plVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  byte *pbVar6;
  byte *pbVar7;
  string hostname;
  string ip;
  ifstream fhost;
  char line [400];
  char host_path [260];
  key_type local_518;
  undefined1 *local_4f8;
  undefined8 local_4f0;
  undefined1 local_4e8 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_4d8;
  long local_4d0 [65];
  byte local_2c8 [400];
  char local_138 [264];
  
  builtin_strncpy(local_138,"/etc/hosts",0xb);
  std::ifstream::ifstream(local_4d0,local_138,_S_in);
  local_4d8 = &this->hosts_;
LAB_00111556:
  std::ios::widen((char)*(undefined8 *)(local_4d0[0] + -0x18) + (char)local_4d0);
  plVar3 = (long *)std::istream::getline((char *)local_4d0,(long)local_2c8,-0x70);
  if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
    std::ifstream::close();
    std::ifstream::~ifstream(local_4d0);
    return;
  }
  pbVar6 = local_2c8;
  pbVar7 = local_2c8;
  do {
    pbVar6 = pbVar6 + 1;
    bVar2 = *pbVar7;
    if (bVar2 < 0x20) {
      if (bVar2 != 9) break;
    }
    else if (bVar2 != 0x20) {
      if (bVar2 == 0x23) goto LAB_00111556;
      goto LAB_001115c4;
    }
    pbVar7 = pbVar7 + 1;
  } while( true );
  if (bVar2 == 0) goto LAB_00111556;
LAB_001115c4:
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  local_518._M_string_length = 0;
  local_518.field_2._M_local_buf[0] = '\0';
  local_4f8 = local_4e8;
  local_4f0 = 0;
  local_4e8[0] = 0;
  while( true ) {
    bVar2 = *pbVar7;
    uVar4 = (ulong)bVar2;
    if (bVar2 == 0) break;
    if ((bVar2 == 0x20) || (bVar2 == 9)) goto LAB_00111618;
    pbVar7 = pbVar7 + 1;
    pbVar6 = pbVar6 + 1;
    std::__cxx11::string::push_back((char)&local_4f8);
  }
LAB_0011166a:
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p);
  }
  goto LAB_00111556;
LAB_00111618:
  while (((char)uVar4 == '\t' || ((int)uVar4 == 0x20))) {
    pbVar1 = pbVar7 + 1;
    pbVar7 = pbVar7 + 1;
    pbVar6 = pbVar6 + 1;
    uVar4 = (ulong)*pbVar1;
  }
  if ((int)uVar4 != 0) {
    while ((0x20 < (byte)uVar4 || ((0x100000201U >> (uVar4 & 0x3f) & 1) == 0))) {
      std::__cxx11::string::push_back((char)&local_518);
      bVar2 = *pbVar6;
      pbVar6 = pbVar6 + 1;
      uVar4 = (ulong)bVar2;
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_4d8,&local_518);
    std::__cxx11::string::_M_assign((string *)pmVar5);
  }
  goto LAB_0011166a;
}

Assistant:

void DNSResolve::ParseHosts()
{
    char host_path[260];
#ifdef _WIN32
    GetWindowsDirectoryA(host_path, 260);
    strcat(host_path, "\\system32\\drivers\\etc\\hosts");
#else
    strcpy(host_path, "/etc/hosts");
#endif
    ifstream fhost(host_path);
    char line[400];
    while (fhost.getline(line, 400))
    {
        char* p = line;
        while (*p == ' ' || *p == '\t') p++;
        if (*p == '\0' || *p == '#') continue;
        string hostname, ip;
        while (*p != ' ' && *p != '\t' && *p != '\0')
        {
            ip.push_back(*p++);
        }
        if (*p == '\0') continue;
        while (*p == ' ' || *p == '\t') p++;
        if (*p == '\0') continue;
        while (*p != ' ' && *p != '\t' && *p != '\0')
        {
            hostname.push_back(*p++);
        }
        hosts_[hostname] = ip;
    }
    fhost.close();
}